

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O3

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonValue *other)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  longlong __tmp;
  long in_FS_OFFSET;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  qint64 local_28;
  QCborContainerPrivate *local_20;
  Type local_18;
  undefined4 uStack_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (other->value).n;
  (this->value).n = local_28;
  pQVar2 = (other->value).container;
  (other->value).container = (QCborContainerPrivate *)0x0;
  (this->value).container = pQVar2;
  TVar1 = (other->value).t;
  (other->value).t = Undefined;
  (this->value).t = TVar1;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0x117;
  (other->value).n = 0;
  local_20 = (other->value).container;
  (other->value).container = (QCborContainerPrivate *)0x0;
  TVar1 = (other->value).t;
  (other->value).t = Null;
  _local_18 = CONCAT44(0xaaaaaaaa,TVar1);
  QCborValue::~QCborValue((QCborValue *)&local_28);
  QCborValue::~QCborValue((QCborValue *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(QJsonValue &&other) noexcept
    : value(std::move(other.value))
{
    other.value = QCborValue(nullptr);
}